

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O1

void __thiscall CHog::exportFeatVect(CHog *this,string *exportPath,int x,int y,int w,int h,int l)

{
  histCell **pphVar1;
  histCell *phVar2;
  long lVar3;
  void *pvVar4;
  ostream *poVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ofstream of;
  int local_270;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(exportPath->_M_dataplus)._M_p,_S_app);
  iVar7 = h * w;
  pphVar1 = this->hist;
  lVar6 = (long)(x + 1);
  lVar3 = (long)pphVar1[(long)y + 1][lVar6].dim * (long)iVar7;
  uVar11 = 0xffffffffffffffff;
  if (-1 < (int)lVar3) {
    uVar11 = lVar3 * 8;
  }
  pvVar4 = operator_new__(uVar11);
  lVar3 = (long)y + 1;
  if (0 < h) {
    local_270 = (int)lVar3;
    lVar13 = 0;
    uVar11 = 0;
    do {
      uVar9 = (ulong)(uint)w;
      lVar10 = lVar6 * 0x30 + 0x20;
      lVar12 = lVar13;
      if (0 < w) {
        do {
          phVar2 = pphVar1[(long)local_270 + uVar11];
          lVar8 = (long)*(int *)((long)&phVar2->cellBinsHalf + lVar10);
          memcpy((void *)((long)pvVar4 + lVar12 * lVar8 * 8),
                 *(void **)((long)phVar2 + lVar10 + -0x10),lVar8 << 3);
          lVar10 = lVar10 + 0x30;
          lVar12 = lVar12 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + w;
    } while (uVar11 != (uint)h);
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,l);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
  if (0 < iVar7 * this->hist[lVar3][lVar6].dim) {
    lVar13 = 0;
    do {
      poVar5 = std::ostream::_M_insert<double>(*(double *)((long)pvVar4 + lVar13 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (long)this->hist[lVar3][lVar6].dim * (long)iVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::ofstream::close();
  operator_delete__(pvVar4);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _flush;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CHog::exportFeatVect(string exportPath, int x, int y, int w, int h, int l)
{
    ofstream of(exportPath.c_str(), ios::app);
    x += 1;
    y += 1;
    double* featVect = new double[w*h*hist[y][x].dim];
    for(int i=0; i<h; i++)
    {
        for(int j=0; j<w; j++)
            memcpy(featVect+(i*w+j)*hist[y+i][x+j].dim, hist[y+i][x+j].feat, sizeof(double)*hist[y+i][x+j].dim);
    }
    of<<l<<"\t";
    for(int n=0; n<w*h*hist[y][x].dim; n++)
//        of<<n+1<<":"<<featVect[n]<<"\t";
        of<<featVect[n]<<"\t";
    of<<"\n";
    of.close();
    delete[] featVect;
}